

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlist.c
# Opt level: O1

void dlist_destroy(dlist_head_t *head,_func_void_void_ptr *free)

{
  dlist_s *pdVar1;
  dlist_s *__ptr;
  
  if (head != (dlist_head_t *)0x0) {
    head->num = 0;
    head->end = (dlist_s *)0x0;
    __ptr = head->dlist;
    while (__ptr != (dlist_s *)0x0) {
      pdVar1 = __ptr->next;
      if (__ptr->data != (void *)0x0 && free != (_func_void_void_ptr *)0x0) {
        (*free)(__ptr->data);
      }
      ::free(__ptr);
      __ptr = pdVar1;
    }
    return;
  }
  __assert_fail("head != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/dlist.c",0x46,
                "void dlist_destroy(dlist_head_t *, void (*)(void *))");
}

Assistant:

void dlist_destroy(dlist_head_t *head,
                   void (*free)(void *data)) {
  assert(head != NULL);
  
  dlist_t *dlist, *next;
  
  head->num = 0;
  head->end = NULL;
  
  if (!(next = head->dlist))
    return;
  
  while (next) {
    dlist = next;
    next = dlist->next;
    dlist_delete(dlist, free);
  }
}